

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O1

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>
               (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                *container)

{
  pointer ppPVar1;
  ParseInfoTree *this;
  __normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
  temp;
  pointer ppPVar2;
  
  if (container !=
      (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
       *)0x0) {
    ppPVar1 = (container->
              super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppPVar2 = (container->
                   super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1;
        ppPVar2 = ppPVar2 + 1) {
      this = *ppPVar2;
      if (this != (ParseInfoTree *)0x0) {
        TextFormat::ParseInfoTree::~ParseInfoTree(this);
        operator_delete(this,0x60);
      }
    }
    ppPVar2 = (container->
              super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
      (container->
      super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}